

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGen.cpp
# Opt level: O2

RandomGen * RandomGen::rndm(void)

{
  if (m_pInstance == (RandomGen *)0x0) {
    m_pInstance = (RandomGen *)operator_new(0x18);
    (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s0_ =
         0xc1f651c67c62c6e0;
    (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s1_ =
         0x30d89576f866ac9f;
    m_pInstance->rng_locked = false;
  }
  return m_pInstance;
}

Assistant:

RandomGen* RandomGen::rndm() {
  if (!m_pInstance) m_pInstance = new RandomGen;
  return m_pInstance;
}